

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int c,int type)

{
  Mat m;
  Mat local_58;
  
  (**this->_vptr_ModelBin)(&local_58,this,(ulong)(uint)(h * w * c),(ulong)(uint)type);
  if ((local_58.data == (void *)0x0) || ((long)local_58.c * local_58.cstep == 0)) {
    __return_storage_ptr__->data = local_58.data;
    __return_storage_ptr__->refcount = local_58.refcount;
    __return_storage_ptr__->elemsize = local_58.elemsize;
    __return_storage_ptr__->dims = local_58.dims;
    if (local_58.refcount != (int *)0x0) {
      LOCK();
      *local_58.refcount = *local_58.refcount + 1;
      UNLOCK();
    }
    __return_storage_ptr__->w = local_58.w;
    __return_storage_ptr__->h = local_58.h;
    __return_storage_ptr__->c = local_58.c;
    __return_storage_ptr__->cstep = local_58.cstep;
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_58,w,h,c);
  }
  if (local_58.refcount != (int *)0x0) {
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if ((*local_58.refcount == 0) && (local_58.data != (void *)0x0)) {
      free(*(void **)((long)local_58.data + -8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}